

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

bool __thiscall cmArchiveWrite::AddData(cmArchiveWrite *this,char *file,size_t size)

{
  size_t sVar1;
  bool bVar2;
  size_t s;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  ifstream fin;
  char buffer [16384];
  string local_42e0;
  string local_42c0;
  string local_42a0;
  char *local_4280;
  string *local_4278;
  undefined8 local_4270;
  char *local_4268;
  undefined8 local_4260;
  size_t local_4258;
  char *local_4250;
  string *local_4248;
  long local_4240;
  size_t local_4238;
  byte abStack_4220 [488];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_4038;
  size_t local_4020;
  char *local_4018;
  undefined8 local_4010;
  undefined8 local_4008;
  char *local_4000;
  undefined8 local_3ff8;
  size_type local_3ff0;
  char *local_3fe8;
  string *local_3fe0;
  
  std::ifstream::ifstream(&local_4240,file,_S_in|_S_bin);
  if ((abStack_4220[*(long *)(local_4240 + -0x18)] & 5) == 0) {
    bVar2 = true;
    if (size != 0) {
      do {
        s = 0x4000;
        if (size < 0x4000) {
          s = size;
        }
        std::istream::read((char *)&local_4240,(long)&local_4038);
        if (local_4238 != s) {
          cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
          local_42a0._M_dataplus._M_p = (pointer)0xf;
          local_42a0._M_string_length = 0x24458c;
          local_42a0.field_2._M_allocated_capacity = 0;
          local_42a0.field_2._8_8_ = strlen(file);
          local_4278 = (string *)0x0;
          local_4270 = 3;
          local_4268 = "\": ";
          local_4260 = 0;
          local_4258 = local_42c0._M_string_length;
          local_4250 = local_42c0._M_dataplus._M_p;
          views_00._M_len = 4;
          views_00._M_array = (iterator)&local_42a0;
          local_4280 = file;
          local_4248 = &local_42c0;
          cmCatViews(&local_42e0,views_00);
LAB_00121c40:
          std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_42e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_42e0._M_dataplus._M_p != &local_42e0.field_2) {
            operator_delete(local_42e0._M_dataplus._M_p,local_42e0.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_42c0._M_dataplus._M_p != &local_42c0.field_2) goto LAB_00121c81;
          goto LAB_00121c89;
        }
        sVar1 = archive_write_data(this->Archive,&local_4038,s);
        if (sVar1 != s) {
          cm_archive_error_string_abi_cxx11_(&local_42c0,this->Archive);
          local_42a0._M_dataplus._M_p = (pointer)0x14;
          local_42a0._M_string_length = 0x244577;
          local_42a0.field_2._M_allocated_capacity = 0;
          local_42a0.field_2._8_8_ = local_42c0._M_string_length;
          local_4280 = local_42c0._M_dataplus._M_p;
          views_01._M_len = 2;
          views_01._M_array = (iterator)&local_42a0;
          local_4278 = &local_42c0;
          cmCatViews(&local_42e0,views_01);
          goto LAB_00121c40;
        }
        size = size - s;
      } while (size != 0);
    }
  }
  else {
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    local_4038.first._M_len = 0xf;
    local_4038.first._M_str = "Error opening \"";
    local_4038.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_4020 = strlen(file);
    local_4010 = 0;
    local_4008 = 3;
    local_4000 = "\": ";
    local_3ff8 = 0;
    local_3ff0 = local_42e0._M_string_length;
    local_3fe8 = local_42e0._M_dataplus._M_p;
    views._M_len = 4;
    views._M_array = &local_4038;
    local_4018 = file;
    local_3fe0 = &local_42e0;
    cmCatViews(&local_42a0,views);
    std::__cxx11::string::operator=((string *)&this->Error,(string *)&local_42a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_42a0._M_dataplus._M_p != &local_42a0.field_2) {
      operator_delete(local_42a0._M_dataplus._M_p,local_42a0.field_2._M_allocated_capacity + 1);
    }
    local_42c0.field_2._M_allocated_capacity = local_42e0.field_2._M_allocated_capacity;
    local_42c0._M_dataplus._M_p = local_42e0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_42e0._M_dataplus._M_p != &local_42e0.field_2) {
LAB_00121c81:
      operator_delete(local_42c0._M_dataplus._M_p,local_42c0.field_2._M_allocated_capacity + 1);
    }
LAB_00121c89:
    bVar2 = false;
  }
  std::ifstream::~ifstream(&local_4240);
  return bVar2;
}

Assistant:

bool cmArchiveWrite::AddData(const char* file, size_t size)
{
  cmsys::ifstream fin(file, std::ios::in | std::ios::binary);
  if (!fin) {
    this->Error = cmStrCat("Error opening \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }

  char buffer[16384];
  size_t nleft = size;
  while (nleft > 0) {
    using ssize_type = std::streamsize;
    size_t const nnext = nleft > sizeof(buffer) ? sizeof(buffer) : nleft;
    ssize_type const nnext_s = static_cast<ssize_type>(nnext);
    fin.read(buffer, nnext_s);
    // Some stream libraries (older HPUX) return failure at end of
    // file on the last read even if some data were read.  Check
    // gcount instead of trusting the stream error status.
    if (static_cast<size_t>(fin.gcount()) != nnext) {
      break;
    }
    if (archive_write_data(this->Archive, buffer, nnext) != nnext_s) {
      this->Error = cmStrCat("archive_write_data: ",
                             cm_archive_error_string(this->Archive));
      return false;
    }
    nleft -= nnext;
  }
  if (nleft > 0) {
    this->Error = cmStrCat("Error reading \"", file,
                           "\": ", cmSystemTools::GetLastSystemError());
    return false;
  }
  return true;
}